

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

string * __thiscall
polyscope::SurfaceMesh::getMaterial_abi_cxx11_(string *__return_storage_ptr__,SurfaceMesh *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->material).value);
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceMesh::getMaterial() { return material.get(); }